

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationbuilder.cpp
# Opt level: O3

uint32_t __thiscall
icu_63::CollationBuilder::addOnlyClosure
          (CollationBuilder *this,UnicodeString *nfdPrefix,UnicodeString *nfdString,int64_t *newCEs,
          int32_t newCEsLength,uint32_t ce32,UErrorCode *errorCode)

{
  short sVar1;
  UBool UVar2;
  int iVar3;
  undefined4 uVar4;
  bool bVar5;
  bool bVar6;
  UnicodeString prefix;
  UnicodeString str;
  CanonicalIterator stringIter;
  CanonicalIterator prefixIter;
  UnicodeString local_240;
  UnicodeString local_200;
  undefined1 local_1c0 [200];
  CanonicalIterator local_f8;
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if ((ushort)(nfdPrefix->fUnion).fStackFields.fLengthAndFlags < 0x20) {
      CanonicalIterator::CanonicalIterator(&local_f8,nfdString,errorCode);
      if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
        local_1c0._0_8_ = &PTR__UnicodeString_003f5be0;
        local_1c0._8_2_ = 2;
        while (CanonicalIterator::next(&local_240,&local_f8),
              (local_240.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
          UVar2 = ignoreString(this,&local_240,errorCode);
          if (UVar2 == '\0') {
            if ((local_240.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
              uVar4 = local_240.fUnion.fFields.fLength;
              if (-1 < local_240.fUnion.fStackFields.fLengthAndFlags) {
                uVar4 = (int)local_240.fUnion.fStackFields.fLengthAndFlags >> 5;
              }
              sVar1 = (nfdString->fUnion).fStackFields.fLengthAndFlags;
              if (sVar1 < 0) {
                iVar3 = (nfdString->fUnion).fFields.fLength;
              }
              else {
                iVar3 = (int)sVar1 >> 5;
              }
              if ((((int)sVar1 & 1U) == 0) && (uVar4 == iVar3)) {
                UVar2 = UnicodeString::doEquals(&local_240,nfdString,uVar4);
                bVar5 = UVar2 != '\0';
                goto LAB_00238fb4;
              }
            }
            else {
              bVar5 = (bool)(*(byte *)&nfdString->fUnion & 1);
LAB_00238fb4:
              if (bVar5 != false) goto LAB_00238fe5;
            }
            ce32 = addIfDifferent(this,(UnicodeString *)local_1c0,&local_240,newCEs,newCEsLength,
                                  ce32,errorCode);
            if (U_ZERO_ERROR < *errorCode) break;
          }
LAB_00238fe5:
          UnicodeString::~UnicodeString(&local_240);
        }
        UnicodeString::~UnicodeString(&local_240);
        UnicodeString::~UnicodeString((UnicodeString *)local_1c0);
        CanonicalIterator::~CanonicalIterator(&local_f8);
      }
      else {
        CanonicalIterator::~CanonicalIterator(&local_f8);
      }
    }
    else {
      CanonicalIterator::CanonicalIterator(&local_f8,nfdPrefix,errorCode);
      CanonicalIterator::CanonicalIterator((CanonicalIterator *)local_1c0,nfdString,errorCode);
      if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
        while (CanonicalIterator::next(&local_240,&local_f8),
              (local_240.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
          if ((*errorCode < U_ILLEGAL_ARGUMENT_ERROR) &&
             (iVar3 = (*(this->fcd->super_UObject)._vptr_UObject[0xb])
                                (this->fcd,&local_240,errorCode), (char)iVar3 != '\0')) {
            if ((local_240.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
              uVar4 = local_240.fUnion.fFields.fLength;
              if (-1 < local_240.fUnion.fStackFields.fLengthAndFlags) {
                uVar4 = (int)local_240.fUnion.fStackFields.fLengthAndFlags >> 5;
              }
              sVar1 = (nfdPrefix->fUnion).fStackFields.fLengthAndFlags;
              if (sVar1 < 0) {
                iVar3 = (nfdPrefix->fUnion).fFields.fLength;
              }
              else {
                iVar3 = (int)sVar1 >> 5;
              }
              bVar5 = false;
              if ((((int)sVar1 & 1U) == 0) && (bVar5 = false, uVar4 == iVar3)) {
                UVar2 = UnicodeString::doEquals(&local_240,nfdPrefix,uVar4);
                bVar5 = UVar2 != '\0';
              }
            }
            else {
              bVar5 = (bool)(*(byte *)&nfdPrefix->fUnion & 1);
            }
            while (CanonicalIterator::next(&local_200,(CanonicalIterator *)local_1c0),
                  (local_200.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
              UVar2 = ignoreString(this,&local_200,errorCode);
              if (UVar2 == '\0') {
                if (bVar5 != false) {
                  if ((local_200.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
                    uVar4 = local_200.fUnion.fFields.fLength;
                    if (-1 < local_200.fUnion.fStackFields.fLengthAndFlags) {
                      uVar4 = (int)local_200.fUnion.fStackFields.fLengthAndFlags >> 5;
                    }
                    sVar1 = (nfdString->fUnion).fStackFields.fLengthAndFlags;
                    if (sVar1 < 0) {
                      iVar3 = (nfdString->fUnion).fFields.fLength;
                    }
                    else {
                      iVar3 = (int)sVar1 >> 5;
                    }
                    if ((((int)sVar1 & 1U) != 0) || (uVar4 != iVar3)) goto LAB_00238e61;
                    UVar2 = UnicodeString::doEquals(&local_200,nfdString,uVar4);
                    bVar6 = UVar2 != '\0';
                  }
                  else {
                    bVar6 = (bool)(*(byte *)&nfdString->fUnion & 1);
                  }
                  if (bVar6 != false) goto LAB_00238e8d;
                }
LAB_00238e61:
                ce32 = addIfDifferent(this,&local_240,&local_200,newCEs,newCEsLength,ce32,errorCode)
                ;
                if (U_ZERO_ERROR < *errorCode) {
                  UnicodeString::~UnicodeString(&local_200);
                  UnicodeString::~UnicodeString(&local_240);
                  goto LAB_00239032;
                }
              }
LAB_00238e8d:
              UnicodeString::~UnicodeString(&local_200);
            }
            UnicodeString::~UnicodeString(&local_200);
            CanonicalIterator::reset((CanonicalIterator *)local_1c0);
          }
          UnicodeString::~UnicodeString(&local_240);
        }
        UnicodeString::~UnicodeString(&local_240);
      }
LAB_00239032:
      CanonicalIterator::~CanonicalIterator((CanonicalIterator *)local_1c0);
      CanonicalIterator::~CanonicalIterator(&local_f8);
    }
  }
  return ce32;
}

Assistant:

uint32_t
CollationBuilder::addOnlyClosure(const UnicodeString &nfdPrefix, const UnicodeString &nfdString,
                                 const int64_t newCEs[], int32_t newCEsLength, uint32_t ce32,
                                 UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return ce32; }

    // Map from canonically equivalent input to the CEs. (But not from the all-NFD input.)
    if(nfdPrefix.isEmpty()) {
        CanonicalIterator stringIter(nfdString, errorCode);
        if(U_FAILURE(errorCode)) { return ce32; }
        UnicodeString prefix;
        for(;;) {
            UnicodeString str = stringIter.next();
            if(str.isBogus()) { break; }
            if(ignoreString(str, errorCode) || str == nfdString) { continue; }
            ce32 = addIfDifferent(prefix, str, newCEs, newCEsLength, ce32, errorCode);
            if(U_FAILURE(errorCode)) { return ce32; }
        }
    } else {
        CanonicalIterator prefixIter(nfdPrefix, errorCode);
        CanonicalIterator stringIter(nfdString, errorCode);
        if(U_FAILURE(errorCode)) { return ce32; }
        for(;;) {
            UnicodeString prefix = prefixIter.next();
            if(prefix.isBogus()) { break; }
            if(ignorePrefix(prefix, errorCode)) { continue; }
            UBool samePrefix = prefix == nfdPrefix;
            for(;;) {
                UnicodeString str = stringIter.next();
                if(str.isBogus()) { break; }
                if(ignoreString(str, errorCode) || (samePrefix && str == nfdString)) { continue; }
                ce32 = addIfDifferent(prefix, str, newCEs, newCEsLength, ce32, errorCode);
                if(U_FAILURE(errorCode)) { return ce32; }
            }
            stringIter.reset();
        }
    }
    return ce32;
}